

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O2

void objundo(mcmcxdef *mctx,objucxdef *undoctx)

{
  ushort uVar1;
  
  uVar1 = undoctx->objucxprv;
  if (uVar1 == undoctx->objucxhead) {
    errsigf(undoctx->objucxerr,"TADS",0xc9);
  }
  while( true ) {
    if (undoctx->objucxbuf[uVar1] == '\x03') {
      do {
        obj1undo(mctx,undoctx);
      } while (undoctx->objucxhead != uVar1);
      return;
    }
    if (uVar1 == undoctx->objucxtail) break;
    uVar1 = *(ushort *)(undoctx->objucxbuf + (ulong)uVar1 + 1);
  }
  errsigf(undoctx->objucxerr,"TADS",0xca);
}

Assistant:

void objundo(mcmcxdef *mctx, objucxdef *undoctx)
{
    ushort prv;
    ushort sav;

    /* see if there's any more undo information */
    if (undoctx->objucxprv == undoctx->objucxhead)
        errsig(undoctx->objucxerr, ERR_NOUNDO);

    /* look for most recent savepoint marker */
    for (prv = undoctx->objucxprv ;; )
    {
        if (undoctx->objucxbuf[prv] == OBJUSAV)
        {
            sav = prv;
            break;
        }
        
        /* if we've reached the tail, there are no more undo records */
        if (prv == undoctx->objucxtail)
            errsig(undoctx->objucxerr, ERR_ICUNDO);

        /* get previous record */
        memcpy(&prv, &undoctx->objucxbuf[prv+1], sizeof(prv));
    }
    
    /* now undo everything until we get to the savepoint */
    do { obj1undo(mctx, undoctx); } while (undoctx->objucxhead != sav);
}